

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O1

err_t btokCVCIss(octet *cert,size_t *cert_len,btok_cvc_t *cvc,octet *certa,size_t certa_len,
                octet *privkeya,size_t privkeya_len)

{
  err_t eVar1;
  btok_cvc_t *cvc_00;
  
  cvc_00 = (btok_cvc_t *)blobCreate(0x128);
  if (cvc_00 == (btok_cvc_t *)0x0) {
    eVar1 = 0x6e;
  }
  else {
    eVar1 = btokCVCUnwrap(cvc_00,certa,certa_len,(octet *)0x0,0);
    if (eVar1 == 0) {
      eVar1 = btokCVCCheck2(cvc,cvc_00);
      if (eVar1 == 0) {
        eVar1 = btokKeypairVal(privkeya,privkeya_len,cvc_00->pubkey,cvc_00->pubkey_len);
        if (eVar1 == 0) {
          eVar1 = btokCVCWrap(cert,cert_len,cvc,privkeya,privkeya_len);
        }
      }
    }
    blobClose(cvc_00);
  }
  return eVar1;
}

Assistant:

err_t btokCVCIss(octet cert[], size_t* cert_len, btok_cvc_t* cvc,
	const octet certa[], size_t certa_len, const octet privkeya[],
	size_t privkeya_len)
{
	err_t code;
	btok_cvc_t* cvca;
	// разобрать сертификат издателя
	cvca = (btok_cvc_t*)blobCreate(sizeof(btok_cvc_t));
	if (!cvca)
		return ERR_OUTOFMEMORY;
	code = btokCVCUnwrap(cvca, certa, certa_len, 0, 0);
	ERR_CALL_HANDLE(code, blobClose(cvca));
	// проверить содержимое выпускаемого сертификата
	code = btokCVCCheck2(cvc, cvca);
	ERR_CALL_HANDLE(code, blobClose(cvca));
	// проверить ключи издателя
	code = btokKeypairVal(privkeya, privkeya_len, cvca->pubkey,
		cvca->pubkey_len);
	ERR_CALL_HANDLE(code, blobClose(cvca));
	// создать сертификат
	code = btokCVCWrap(cert, cert_len, cvc, privkeya, privkeya_len);
	// завершить
	blobClose(cvca);
	return code;
}